

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.cpp
# Opt level: O0

void __thiscall Paragraph::print(Paragraph *this)

{
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<Paragraph_**,_std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>_> local_20;
  __normal_iterator<Paragraph_**,_std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>_> local_18;
  iterator iter;
  Paragraph *this_local;
  
  iter._M_current = (Paragraph **)this;
  printf("%s\n",(this->super_Section)._text);
  local_18._M_current =
       (Paragraph **)std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>::begin(&this->_sections)
  ;
  while( true ) {
    local_20._M_current =
         (Paragraph **)std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>::end(&this->_sections)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Paragraph_**,_std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>_>
              ::operator*(&local_18);
    if (*ppPVar2 != (Paragraph *)0x0) {
      ppPVar2 = __gnu_cxx::
                __normal_iterator<Paragraph_**,_std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>_>
                ::operator*(&local_18);
      (*((*ppPVar2)->super_Section)._vptr_Section[2])();
    }
    __gnu_cxx::
    __normal_iterator<Paragraph_**,_std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>_>::
    operator++(&local_18);
  }
  return;
}

Assistant:

void Paragraph::print()
{
	printf("%s\n", _text);

	vector<Paragraph*>::iterator iter = _sections.begin();
	for (; iter != _sections.end(); ++iter) {
		if (*iter)
			(*iter)->print();
	}
}